

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kerning.cpp
# Opt level: O1

vector<unsigned_short,_std::allocator<unsigned_short>_> *
dpfb::readCovarageTable
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
          Stream *stream)

{
  iterator iVar1;
  ushort uVar2;
  runtime_error *prVar3;
  ushort uVar4;
  uint16_t value;
  ushort local_5a;
  string local_58;
  uint local_34;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*stream->_vptr_Stream[5])(stream,&local_58,2);
  uVar2 = (ushort)local_58._M_dataplus._M_p << 8 | (ushort)local_58._M_dataplus._M_p >> 8;
  if (uVar2 == 2) {
    (*stream->_vptr_Stream[5])(stream,&local_58,2);
    if ((ushort)local_58._M_dataplus._M_p != 0) {
      local_34 = (uint)(ushort)((ushort)local_58._M_dataplus._M_p << 8 |
                               (ushort)local_58._M_dataplus._M_p >> 8);
      do {
        (*stream->_vptr_Stream[5])(stream,&local_58,2);
        uVar2 = (ushort)local_58._M_dataplus._M_p;
        (*stream->_vptr_Stream[5])(stream,&local_58,2);
        uVar4 = (ushort)local_58._M_dataplus._M_p;
        (*stream->_vptr_Stream[7])(stream,2,1);
        uVar2 = uVar2 << 8 | uVar2 >> 8;
        uVar4 = uVar4 << 8 | uVar4 >> 8;
        if (uVar4 < uVar2) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          str::format_abi_cxx11_
                    (&local_58,"Coverage table format 2 range start id (%u) > end id (%u)",
                     (ulong)uVar2,(ulong)uVar4);
          std::runtime_error::runtime_error(prVar3,(string *)&local_58);
          *(undefined ***)prVar3 = &PTR__runtime_error_001277e0;
          __cxa_throw(prVar3,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
        }
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
                  (__return_storage_ptr__,
                   ((ulong)uVar4 - (ulong)uVar2) +
                   ((long)(__return_storage_ptr__->
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(__return_storage_ptr__->
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 1) + 1);
        for (local_58._M_dataplus._M_p._0_2_ = uVar2; (ushort)local_58._M_dataplus._M_p <= uVar4;
            local_58._M_dataplus._M_p._0_2_ = (ushort)local_58._M_dataplus._M_p + 1) {
          iVar1._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_short,std::allocator<unsigned_short>>::
            _M_realloc_insert<unsigned_short_const&>
                      ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                       __return_storage_ptr__,iVar1,(unsigned_short *)&local_58);
          }
          else {
            *iVar1._M_current = (ushort)local_58._M_dataplus._M_p;
            (__return_storage_ptr__->
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
        }
        local_34 = local_34 - 1;
      } while ((short)local_34 != 0);
    }
  }
  else {
    if (uVar2 != 1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_(&local_58,"Unknown format of coverage table: %u",(ulong)(uint)uVar2);
      std::runtime_error::runtime_error(prVar3,(string *)&local_58);
      *(undefined ***)prVar3 = &PTR__runtime_error_001277e0;
      __cxa_throw(prVar3,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
    (*stream->_vptr_Stream[5])(stream,&local_58,2);
    uVar2 = (ushort)local_58._M_dataplus._M_p;
    uVar4 = (ushort)local_58._M_dataplus._M_p << 8 | (ushort)local_58._M_dataplus._M_p >> 8;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
              (__return_storage_ptr__,(ulong)uVar4);
    if (uVar2 != 0) {
      do {
        (*stream->_vptr_Stream[5])(stream,&local_58,2);
        local_5a = (ushort)local_58._M_dataplus._M_p << 8 | (ushort)local_58._M_dataplus._M_p >> 8;
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(__return_storage_ptr__,iVar1,&local_5a);
        }
        else {
          *iVar1._M_current = local_5a;
          (__return_storage_ptr__->
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::uint16_t> readCovarageTable(Stream& stream)
{
    std::vector<std::uint16_t> result;

    const auto coverageFormat = stream.readU16Be();
    if (coverageFormat == 1) {
        auto glyphCount = stream.readU16Be();
        result.reserve(glyphCount);
        while (glyphCount--)
            result.push_back(stream.readU16Be());
    } else if (coverageFormat == 2) {
        auto rangeCount = stream.readU16Be();
        while (rangeCount--) {
            const auto startGlyphId = stream.readU16Be();
            const auto endGlyphId = stream.readU16Be();
            // Skip startCoverageIndex
            stream.seek(
                sizeof(std::uint16_t), SeekOrigin::cur);

            if (startGlyphId > endGlyphId)
                throw StreamError(str::format(
                    "Coverage table format 2 range start id "
                    "(%" PRIu16 ") > end id (%" PRIu16 ")",
                    startGlyphId,
                    endGlyphId));

            result.reserve(
                result.size() + endGlyphId - startGlyphId + 1);
            for (auto i = startGlyphId; i <= endGlyphId; ++ i)
                result.push_back(i);
        }
    } else
        throw StreamError(str::format(
            "Unknown format of coverage table: %" PRIu16,
            coverageFormat));

    return result;
}